

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::forFixedArray
          (Compilation *comp,ReplicatedAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Type *elementType,bitwidth_t numElements,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  bool bVar1;
  ExpressionSyntax *syntax_00;
  Expression *this;
  SourceRange *args_3;
  ReplicatedAssignmentPatternExpression *result;
  undefined1 local_68 [8];
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elems;
  bool bad;
  Expression *countExpr;
  size_t count;
  Type *pTStack_38;
  bitwidth_t numElements_local;
  Type *elementType_local;
  Type *type_local;
  ASTContext *context_local;
  ReplicatedAssignmentPatternSyntax *syntax_local;
  Compilation *comp_local;
  
  args_3 = &sourceRange;
  countExpr = (Expression *)0x0;
  count._4_4_ = numElements;
  pTStack_38 = elementType;
  elementType_local = type;
  type_local = (Type *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (ReplicatedAssignmentPatternSyntax *)comp;
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->countExpr);
  this = bindReplCount(comp,syntax_00,(ASTContext *)type_local,(size_t *)&countExpr);
  bVar1 = Expression::bad(this);
  if (bVar1) {
    comp_local = (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)0x0);
  }
  else {
    elems.size_._7_1_ = 0;
    sourceRange_00.endLoc = (SourceLocation)((long)&elems.size_ + 7);
    sourceRange_00.startLoc = args_3->endLoc;
    _local_68 = bindExpressionList((ast *)elementType_local,pTStack_38,(Type *)countExpr,
                                   (ulong)count._4_4_,(int)context_local + 0x38,
                                   (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                                   type_local,(ASTContext *)args_3->startLoc,sourceRange_00,
                                   (bool *)args_3);
    comp_local = (Compilation *)
                 BumpAllocator::
                 emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
                           ((BumpAllocator *)syntax_local,elementType_local,this,
                            (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                            local_68,args_3);
    if ((elems.size_._7_1_ & 1) != 0) {
      comp_local = (Compilation *)
                   Expression::badExpr((Compilation *)syntax_local,(Expression *)comp_local);
    }
  }
  return (Expression *)comp_local;
}

Assistant:

Expression& ReplicatedAssignmentPatternExpression::forFixedArray(
    Compilation& comp, const ReplicatedAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, bitwidth_t numElements, SourceRange sourceRange) {

    size_t count = 0;
    auto& countExpr = bindReplCount(comp, *syntax.countExpr, context, count);
    if (countExpr.bad())
        return badExpr(comp, nullptr);

    bool bad = false;
    auto elems = bindExpressionList(type, elementType, count, numElements, syntax.items, context,
                                    sourceRange, bad);

    auto result = comp.emplace<ReplicatedAssignmentPatternExpression>(type, countExpr, elems,
                                                                      sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}